

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::LoopLayerParams::_InternalParse
          (LoopLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  internal *this_01;
  size_t size;
  bool bVar2;
  NeuralNetwork *msg;
  string *s;
  uint uVar3;
  char *field_name;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  undefined8 *puVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  byte *p;
  Arena *pAVar8;
  pair<const_char_*,_unsigned_int> pVar9;
  pair<const_char_*,_unsigned_long> pVar10;
  StringPiece str;
  byte *local_40;
  ArenaStringPtr *local_38;
  
  local_40 = (byte *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    local_38 = &this->conditionvar_;
    do {
      bVar1 = *local_40;
      uVar6 = (uint)bVar1;
      p = local_40 + 1;
      if ((char)bVar1 < '\0') {
        uVar6 = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
        if ((char)*p < '\0') {
          pVar9 = google::protobuf::internal::ReadTagFallback((char *)local_40,uVar6);
          p = (byte *)pVar9.first;
          uVar6 = pVar9.second;
        }
        else {
          p = local_40 + 2;
        }
      }
      uVar3 = (uVar6 >> 3) - 1;
      local_40 = p;
      if (3 < uVar3) goto switchD_0025e8de_default;
      field_name = (char *)((long)&switchD_0025e8de::switchdataD_003a5d0c +
                           (long)(int)(&switchD_0025e8de::switchdataD_003a5d0c)[uVar3]);
      cVar5 = (char)uVar6;
      switch(uVar6 >> 3) {
      case 1:
        if (cVar5 != '\b') break;
        uVar4 = (ulong)(char)*p;
        local_40 = p + 1;
        if ((long)uVar4 < 0) {
          uVar6 = ((uint)*local_40 * 0x80 + (uint)*p) - 0x80;
          if ((char)*local_40 < '\0') {
            local_40 = p;
            pVar10 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar6);
            local_40 = (byte *)pVar10.first;
            this->maxloopiterations_ = pVar10.second;
            goto joined_r0x0025ea0b;
          }
          uVar4 = (ulong)uVar6;
          local_40 = p + 2;
        }
        this->maxloopiterations_ = uVar4;
        goto LAB_0025ea50;
      case 2:
        if (cVar5 != '\x12') break;
        puVar7 = (undefined8 *)(this_00->ptr_ & 0xfffffffffffffffc);
        if ((this_00->ptr_ & 1U) != 0) {
          puVar7 = (undefined8 *)*puVar7;
        }
        s = google::protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_(local_38,puVar7);
        local_40 = (byte *)google::protobuf::internal::InlineGreedyStringParser
                                     (s,(char *)local_40,ctx);
        this_01 = (internal *)(s->_M_dataplus)._M_p;
        size = s->_M_string_length;
        if ((long)size < 0) {
          google::protobuf::stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    (size,"string length exceeds max size");
        }
        str.length_ = 0;
        str.ptr_ = (char *)size;
        bVar2 = google::protobuf::internal::VerifyUTF8(this_01,str,field_name);
        if (!bVar2) {
          return (char *)0x0;
        }
        goto joined_r0x0025ea0b;
      case 3:
        if (cVar5 == '\x1a') {
          msg = this->conditionnetwork_;
          if (msg == (NeuralNetwork *)0x0) {
            pAVar8 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar8 = *(Arena **)pAVar8;
            }
            msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                            (pAVar8);
            this->conditionnetwork_ = msg;
          }
LAB_0025e98f:
          local_40 = (byte *)google::protobuf::internal::ParseContext::ParseMessage
                                       (ctx,&msg->super_MessageLite,(char *)local_40);
          goto joined_r0x0025ea0b;
        }
        break;
      case 4:
        if (cVar5 == '\"') {
          msg = this->bodynetwork_;
          if (msg == (NeuralNetwork *)0x0) {
            pAVar8 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar8 = *(Arena **)pAVar8;
            }
            msg = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>
                            (pAVar8);
            this->bodynetwork_ = msg;
          }
          goto LAB_0025e98f;
        }
      }
switchD_0025e8de_default:
      if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
        if (p == (byte *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
        return (char *)p;
      }
      if ((this_00->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_40 = (byte *)google::protobuf::internal::UnknownFieldParse
                                   (uVar6,unknown,(char *)local_40,ctx);
joined_r0x0025ea0b:
      if (local_40 == (byte *)0x0) {
        return (char *)0x0;
      }
LAB_0025ea50:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_40,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_40;
}

Assistant:

const char* LoopLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // uint64 maxLoopIterations = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          maxloopiterations_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // string conditionVar = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          auto str = _internal_mutable_conditionvar();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, nullptr));
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetwork conditionNetwork = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_conditionnetwork(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.NeuralNetwork bodyNetwork = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_bodynetwork(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}